

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O2

string * __thiscall Tracker::logFramerate_abi_cxx11_(string *__return_storage_ptr__,Tracker *this)

{
  double local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  local_58 = getFramerate(this);
  vera::toString<double>(&local_30,&local_58);
  std::operator+(&local_50,"framerate,",&local_30);
  std::operator+(__return_storage_ptr__,&local_50,"\n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string Tracker::logFramerate() {
    return  "framerate," + vera::toString(getFramerate()) + "\n";// +
            // "fps," + vera::toString( (1./getFramerate()) * 1000.0 ) ;
}